

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int ON_StringCompareOrdinalUTF8
              (char *string1,int element_count1,char *string2,int element_count2,
              bool bOrdinalIgnoreCase)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ON__UINT32 OVar4;
  ON__UINT32 OVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char null_terminator;
  char local_55;
  uint local_54;
  char *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  if ((string1 == (char *)0x0 && element_count1 != 0) ||
     (element_count2 != 0 && string2 == (char *)0x0)) {
    if (string1 == string2 || string1 == (char *)0x0) {
      return -(uint)(string1 != string2);
    }
    if (string2 == (char *)0x0) {
      return 1;
    }
  }
  local_55 = '\0';
  if (element_count1 < 0) {
    element_count1 = ON_String::Length(string1);
  }
  local_40 = (ulong)(uint)element_count2;
  if (element_count2 < 0) {
    uVar3 = ON_String::Length(string2);
    local_40 = (ulong)uVar3;
  }
  if (element_count1 == 0) {
    string1 = &local_55;
  }
  uVar3 = (uint)local_40;
  if (uVar3 == 0) {
    string2 = &local_55;
  }
  if (element_count1 == uVar3 && string1 == string2) {
    return 0;
  }
  uVar7 = local_40;
  if (element_count1 < (int)uVar3) {
    uVar7 = (ulong)(uint)element_count1;
  }
  local_54 = (uint)uVar7;
  if (bOrdinalIgnoreCase) {
    if (0 < (int)local_54) {
      local_50 = string1 + uVar7;
      local_48 = string2 + uVar7;
      local_38 = (long)element_count1;
      if ((long)(int)uVar3 < (long)element_count1) {
        local_38 = (long)(int)uVar3;
      }
      lVar8 = 0;
      do {
        OVar4 = MapCodePointOrdinal((int)string1[lVar8],0x7f,
                                    MinimumOrdinal - ((int)string1[lVar8] - 0x41U < 0x3a));
        OVar5 = MapCodePointOrdinal((int)string2[lVar8],0x7f,
                                    MinimumOrdinal - ((int)string2[lVar8] - 0x41U < 0x3a));
        if (OVar4 < OVar5) {
          return -1;
        }
        if (OVar4 >= OVar5 && OVar4 != OVar5) {
          return 1;
        }
        lVar8 = lVar8 + 1;
      } while ((int)local_38 != (int)lVar8);
      goto LAB_005c3f87;
    }
  }
  else if (0 < (int)local_54) {
    local_50 = string1 + uVar7;
    local_48 = string2 + uVar7;
    uVar6 = element_count1;
    if ((int)uVar3 < element_count1) {
      uVar6 = uVar3;
    }
    lVar8 = 0;
    do {
      bVar1 = string2[lVar8];
      bVar2 = string1[lVar8];
      if (bVar2 < bVar1) {
        return -1;
      }
      if (bVar2 >= bVar1 && bVar2 != bVar1) {
        return 1;
      }
      lVar8 = lVar8 + 1;
    } while (uVar6 != (uint)lVar8);
    goto LAB_005c3f87;
  }
  local_54 = 0;
  local_48 = string2;
  local_50 = string1;
LAB_005c3f87:
  uVar3 = local_54;
  if ((int)local_54 < element_count1) {
    lVar8 = 0;
    do {
      if (local_50[lVar8] != '\0') {
        return 1;
      }
      lVar8 = lVar8 + 1;
      uVar3 = element_count1;
    } while (element_count1 - local_54 != (int)lVar8);
  }
  if ((int)uVar3 < (int)local_40) {
    lVar8 = 0;
    do {
      if (local_48[lVar8] != '\0') {
        return -1;
      }
      lVar8 = lVar8 + 1;
    } while ((int)local_40 - uVar3 != (int)lVar8);
  }
  return 0;
}

Assistant:

int ON_StringCompareOrdinalUTF8(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(char,ON_String::Length,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (unsigned char)(*string1++);
      c2 = (unsigned char)(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return 1;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return -1;
  }

  return 0;
}

int ON_StringCompareOrdinalUTF16(
  const ON__UINT16* string1,
  int element_count1,
  const ON__UINT16* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(ON__UINT16,ON_StringLengthUTF16,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF16ToIgnoreCase(*string1++);
      c2 = OrdinalUTF16ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (*string1++);
      c2 = (*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return 1;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return -1;
  }

  return 0;
}

int ON_StringCompareOrdinalUTF32(
  const ON__UINT32* string1,
  int element_count1,
  const ON__UINT32* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(ON__UINT32,ON_StringLengthUTF32,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF32ToIgnoreCase(*string1++);
      c2 = OrdinalUTF32ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (*string1++);
      c2 = (*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }